

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  mz_uint64 mVar1;
  bool bVar2;
  mz_bool mVar3;
  mz_uint mVar4;
  tdefl_status tVar5;
  size_t sVar6;
  size_t sVar7;
  mz_ulong mVar8;
  ulong in_RCX;
  mz_uint8 *in_RDX;
  char *in_RSI;
  mz_zip_archive *in_RDI;
  long in_R8;
  ushort in_R9W;
  uint in_stack_00000008;
  ulong in_stack_00000010;
  undefined4 in_stack_00000018;
  mz_zip_writer_add_state state;
  time_t cur_time;
  mz_zip_internal_state *pState;
  mz_bool store_data_uncompressed;
  tdefl_compressor *pComp;
  mz_uint8 local_dir_header [30];
  mz_uint16 in_stack_000000c0;
  size_t archive_name_size;
  mz_uint64 comp_size;
  mz_uint64 cur_archive_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint16 in_stack_000000e8;
  mz_uint num_alignment_padding_bytes;
  mz_uint ext_attributes;
  mz_uint level;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 method;
  mz_uint32 in_stack_00000e4c;
  mz_uint64 in_stack_00000e50;
  mz_zip_archive *in_stack_00000e58;
  tdefl_flush in_stack_fffffffffffffe2c;
  mz_uint16 *in_stack_fffffffffffffe30;
  undefined4 uVar9;
  tdefl_put_buf_func_ptr in_stack_fffffffffffffe38;
  uint uVar10;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  mz_uint32 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  mz_uint16 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5a;
  undefined4 in_stack_fffffffffffffe5c;
  mz_uint16 in_stack_fffffffffffffe60;
  mz_uint16 in_stack_fffffffffffffe68;
  mz_uint16 in_stack_fffffffffffffe70;
  bool local_171;
  void *in_stack_fffffffffffffea8;
  mz_zip_internal_state *pmVar11;
  mz_uint16 extra_size;
  undefined4 in_stack_fffffffffffffeb8;
  uint uVar12;
  void *pvVar13;
  mz_uint16 filename_size;
  char *in_stack_fffffffffffffec8;
  mz_zip_archive *in_stack_fffffffffffffed0;
  ulong local_108;
  ulong local_100;
  uint local_e4;
  
  mVar1 = in_RDI->m_archive_size;
  local_100 = in_RDI->m_archive_size;
  pvVar13 = (void *)0x0;
  if ((int)in_stack_00000008 < 0) {
    in_stack_00000008 = 6;
  }
  local_e4 = in_stack_00000008 & 0xf;
  local_171 = local_e4 == 0 || (in_stack_00000008 & 0x400) != 0;
  uVar12 = (uint)local_171;
  if (((((((in_RDI == (mz_zip_archive *)0x0) || (in_RDI->m_pState == (mz_zip_internal_state *)0x0))
         || (in_RDI->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
        ((in_RCX != 0 && (in_RDX == (mz_uint8 *)0x0)))) ||
       ((in_RSI == (char *)0x0 || ((in_R9W != 0 && (in_R8 == 0)))))) ||
      (in_RDI->m_total_files == 0xffff)) || (10 < local_e4)) {
    return 0;
  }
  pmVar11 = in_RDI->m_pState;
  if (((in_stack_00000008 & 0x400) == 0) && (in_stack_00000010 != 0)) {
    return 0;
  }
  if ((0xffffffff < in_RCX) || (0xffffffff < in_stack_00000010)) {
    return 0;
  }
  mVar3 = (anonymous_namespace)::miniz::mz_zip_writer_validate_archive_name(in_RSI);
  if (mVar3 == 0) {
    return 0;
  }
  time((time_t *)&stack0xfffffffffffffea8);
  (anonymous_namespace)::miniz::mz_zip_time_to_dos_time
            (CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (mz_uint16 *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  sVar6 = strlen(in_RSI);
  if (0xffff < sVar6) {
    return 0;
  }
  mVar4 = (anonymous_namespace)::miniz::mz_zip_writer_compute_padding_needed_for_file_alignment
                    (in_RDI);
  if ((in_RDI->m_total_files == 0xffff) ||
     (0xffffffff < in_RDI->m_archive_size + (ulong)mVar4 + 0x4c + (ulong)in_R9W + sVar6)) {
    return 0;
  }
  if (((sVar6 != 0) && (in_RSI[sVar6 - 1] == '/')) && ((in_RCX != 0 || (in_stack_00000010 != 0)))) {
    return 0;
  }
  if (((pmVar11->m_central_dir).m_capacity <
       (pmVar11->m_central_dir).m_size + sVar6 + 0x2e + (ulong)in_R9W) &&
     (mVar3 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                        ((mz_zip_archive *)
                         CONCAT44(in_stack_fffffffffffffe5c,
                                  CONCAT22(in_stack_fffffffffffffe5a,in_stack_fffffffffffffe58)),
                         (mz_zip_array *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         in_stack_fffffffffffffe44), mVar3 == 0)) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  if (!bVar2) {
    return 0;
  }
  if ((pmVar11->m_central_dir_offsets).m_capacity < (pmVar11->m_central_dir_offsets).m_size + 1) {
    mVar3 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                      ((mz_zip_archive *)
                       CONCAT44(in_stack_fffffffffffffe5c,
                                CONCAT22(in_stack_fffffffffffffe5a,in_stack_fffffffffffffe58)),
                       (mz_zip_array *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                       ,CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       in_stack_fffffffffffffe44);
    extra_size = (mz_uint16)((ulong)pmVar11 >> 0x30);
    if (mVar3 == 0) {
      bVar2 = false;
      goto LAB_001246a4;
    }
  }
  extra_size = (mz_uint16)((ulong)pmVar11 >> 0x30);
  bVar2 = true;
LAB_001246a4:
  if (!bVar2) {
    return 0;
  }
  if (((uVar12 == 0) && (in_RCX != 0)) &&
     (pvVar13 = (*in_RDI->m_pAlloc)(in_RDI->m_pAlloc_opaque,1,0x4df78), pvVar13 == (void *)0x0)) {
    return 0;
  }
  mVar3 = (anonymous_namespace)::miniz::mz_zip_writer_write_zeros
                    (in_stack_00000e58,in_stack_00000e50,in_stack_00000e4c);
  if (mVar3 == 0) {
    (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,pvVar13);
    return 0;
  }
  local_100 = (ulong)mVar4 + 0x1e + local_100;
  memset(&stack0xfffffffffffffec8,0,0x1e);
  sVar7 = (*in_RDI->m_pWrite)(in_RDI->m_pIO_opaque,local_100,in_RSI,sVar6);
  if (sVar7 != sVar6) {
    (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,pvVar13);
    return 0;
  }
  local_100 = sVar6 + local_100;
  if ((in_stack_00000008 & 0x400) == 0) {
    mVar8 = mz_crc32(0,in_RDX,in_RCX);
    in_stack_00000018 = (undefined4)mVar8;
    if (in_RCX < 4) {
      local_e4 = 0;
      uVar12 = 1;
    }
  }
  if (uVar12 == 0) {
    if (in_RCX != 0) {
      tdefl_create_comp_flags_from_zip_params(local_e4,-0xf,0);
      tVar5 = tdefl_init((tdefl_compressor *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe2c);
      if ((tVar5 != TDEFL_STATUS_OKAY) ||
         (tVar5 = tdefl_compress_buffer
                            ((tdefl_compressor *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                             in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30,
                             in_stack_fffffffffffffe2c), tVar5 != TDEFL_STATUS_DONE)) {
        (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,pvVar13);
        return 0;
      }
    }
    uVar10 = (uint)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    local_108 = 0;
  }
  else {
    sVar7 = (*in_RDI->m_pWrite)(in_RDI->m_pIO_opaque,local_100,in_RDX,in_RCX);
    uVar10 = (uint)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    if (sVar7 != in_RCX) {
      (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,pvVar13);
      return 0;
    }
    local_100 = in_RCX + local_100;
    local_108 = in_RCX;
  }
  (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,pvVar13);
  filename_size = 0;
  if ((local_108 < 0x100000000) && (local_100 < 0x100000000)) {
    mVar3 = (anonymous_namespace)::miniz::mz_zip_writer_create_local_dir_header
                      ((mz_zip_archive *)((ulong)in_stack_fffffffffffffe44 << 0x20),
                       (mz_uint8 *)((ulong)uVar10 << 0x20),(mz_uint16)((uint)uVar9 >> 0x10),
                       (mz_uint16)uVar9,CONCAT44(in_stack_fffffffffffffe2c,in_stack_00000018),
                       0x124b38,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                       in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,in_stack_fffffffffffffe70
                      );
    if (mVar3 == 0) {
      return 0;
    }
    sVar7 = (*in_RDI->m_pWrite)(in_RDI->m_pIO_opaque,mVar4 + mVar1,&stack0xfffffffffffffec8,0x1e);
    if (sVar7 == 0x1e) {
      mVar3 = (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                        (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,filename_size,
                         (void *)CONCAT44(uVar12,in_stack_fffffffffffffeb8),extra_size,
                         in_stack_fffffffffffffea8,in_stack_000000c0,archive_name_size,comp_size,
                         (mz_uint32)cur_archive_file_ofs,(mz_uint16)local_dir_header_ofs,
                         in_stack_000000e8,(mz_uint16)ext_attributes,dos_date,(mz_uint64)pComment,
                         (mz_uint32)buf_size);
      if (mVar3 != 0) {
        in_RDI->m_total_files = in_RDI->m_total_files + 1;
        in_RDI->m_archive_size = local_100;
        return 1;
      }
      return 0;
    }
    return 0;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *pZip,
                                 const char *pArchive_name, const void *pBuf,
                                 size_t buf_size, const void *pComment,
                                 mz_uint16 comment_size,
                                 mz_uint level_and_flags, mz_uint64 uncomp_size,
                                 mz_uint32 uncomp_crc32) {
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  tdefl_compressor *pComp = NULL;
  mz_bool store_data_uncompressed;
  mz_zip_internal_state *pState;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;
  store_data_uncompressed =
      ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) ||
      (!pArchive_name) || ((comment_size) && (!pComment)) ||
      (pZip->m_total_files == 0xFFFF) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  pState = pZip->m_pState;

  if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
    return MZ_FALSE;
  // No zip64 support yet
  if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

#ifndef MINIZ_NO_TIME
  {
    time_t cur_time;
    time(&cur_time);
    mz_zip_time_to_dos_time(cur_time, &dos_time, &dos_date);
  }
#endif // #ifndef MINIZ_NO_TIME

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
    // Set DOS Subdirectory attribute bit.
    ext_attributes |= 0x10;
    // Subdirectories cannot contain data.
    if ((buf_size) || (uncomp_size))
      return MZ_FALSE;
  }

  // Try to do any allocations before writing to the archive, so if an
  // allocation fails the file remains unmodified. (A good idea if we're doing
  // an in-place modification.)
  if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir,
                                 MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                     archive_name_size + comment_size)) ||
      (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
    return MZ_FALSE;

  if ((!store_data_uncompressed) && (buf_size)) {
    if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
      return MZ_FALSE;
  }

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
    uncomp_crc32 =
        (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
    uncomp_size = buf_size;
    if (uncomp_size <= 3) {
      level = 0;
      store_data_uncompressed = MZ_TRUE;
    }
  }

  if (store_data_uncompressed) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf,
                       buf_size) != buf_size) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    cur_archive_file_ofs += buf_size;
    comp_size = buf_size;

    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
      method = MZ_DEFLATED;
  } else if (buf_size) {
    mz_zip_writer_add_state state;

    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = cur_archive_file_ofs;
    state.m_comp_size = 0;

    if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                    tdefl_create_comp_flags_from_zip_params(
                        level, -15, MZ_DEFAULT_STRATEGY)) !=
         TDEFL_STATUS_OKAY) ||
        (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) !=
         TDEFL_STATUS_DONE)) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    comp_size = state.m_comp_size;
    cur_archive_file_ofs = state.m_cur_archive_file_ofs;

    method = MZ_DEFLATED;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
  pComp = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}